

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::OptionDetails::OptionDetails(OptionDetails *this,OptionDetails *rhs)

{
  element_type *peVar1;
  shared_ptr<cxxopts::Value> local_38 [2];
  OptionDetails *local_18;
  OptionDetails *rhs_local;
  OptionDetails *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->m_long);
  std::__cxx11::string::string((string *)&this->m_desc,(string *)&local_18->m_desc);
  peVar1 = std::__shared_ptr_access<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_18->m_value);
  (*peVar1->_vptr_Value[2])(local_38);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&this->m_value,local_38);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(local_38);
  this->m_count = local_18->m_count;
  this->m_hash = 0;
  return;
}

Assistant:

OptionDetails(const OptionDetails& rhs)
    : m_desc(rhs.m_desc)
    , m_value(rhs.m_value->clone())
    , m_count(rhs.m_count)
    {
    }